

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

state_status_t __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::prev
          (clockval_dbm_t *this,transition_t *t,bool src_delay_allowed,bool tgt_delay_allowed,
          db_t *bounding_dbm)

{
  bool bVar1;
  status_t sVar2;
  integer_t iVar3;
  clock_constraint_container_t *pcVar4;
  clock_reset_container_t *reset;
  status_t bounding_status;
  undefined1 local_a0 [4];
  state_status_t prev_status;
  clock_reset_container_t scaled_up_reset;
  clock_constraint_container_t scaled_up_guard;
  undefined1 local_60 [8];
  clock_constraint_container_t scaled_up_tgt_invariant;
  clock_constraint_container_t scaled_up_src_invariant;
  db_t *bounding_dbm_local;
  bool tgt_delay_allowed_local;
  bool src_delay_allowed_local;
  transition_t *t_local;
  clockval_dbm_t *this_local;
  
  if (bounding_dbm == (db_t *)0x0) {
    __assert_fail("bounding_dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                  ,0x247,
                  "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
                 );
  }
  bVar1 = tchecker::dbm::is_consistent(bounding_dbm,this->_dim);
  if (!bVar1) {
    __assert_fail("tchecker::dbm::is_consistent(bounding_dbm, _dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                  ,0x248,
                  "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
                 );
  }
  bVar1 = tchecker::dbm::is_tight(bounding_dbm,this->_dim);
  if (!bVar1) {
    __assert_fail("tchecker::dbm::is_tight(bounding_dbm, _dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/path.cc"
                  ,0x249,
                  "tchecker::state_status_t tchecker::zg::path::concrete::clockval_dbm_t::prev(const tchecker::zg::transition_t &, bool, bool, const tchecker::dbm::db_t *)"
                 );
  }
  pcVar4 = ta::transition_t::src_invariant_container(&t->super_transition_t);
  scale_up((clock_constraint_container_t *)
           &scaled_up_tgt_invariant.
            super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,this,pcVar4);
  pcVar4 = ta::transition_t::tgt_invariant_container(&t->super_transition_t);
  scale_up((clock_constraint_container_t *)local_60,this,pcVar4);
  pcVar4 = ta::transition_t::guard_container(&t->super_transition_t);
  scale_up((clock_constraint_container_t *)
           &scaled_up_reset.
            super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage,this,pcVar4);
  reset = ta::transition_t::reset_container(&t->super_transition_t);
  scale_up((clock_reset_container_t *)local_a0,this,reset);
  this_local._4_4_ =
       standard_semantics_t::prev
                 (&this->_semantics,this->_dbm,this->_dim,src_delay_allowed,
                  (clock_constraint_container_t *)
                  &scaled_up_tgt_invariant.
                   super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (clock_constraint_container_t *)
                  &scaled_up_reset.
                   super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (clock_reset_container_t *)local_a0,tgt_delay_allowed,
                  (clock_constraint_container_t *)local_60);
  if (this_local._4_4_ == 1) {
    sVar2 = restrict_to_scaled_up_bounding_dbm(this,bounding_dbm);
    if (sVar2 == NON_EMPTY) {
      simplify(this);
      iVar3 = tchecker::dbm::constrain_to_single_valuation(this->_dbm,this->_dim);
      this->_denominator = this->_denominator * iVar3;
      compute_clock_valuation_from_dbm(this);
      this_local._4_4_ = 1;
    }
    else {
      invalidate(this);
      this_local._4_4_ = 0x4000;
    }
  }
  else {
    invalidate(this);
  }
  std::vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>::~vector
            ((vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_> *)local_a0);
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::~vector
            ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             &scaled_up_reset.
              super__Vector_base<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::~vector
            ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             local_60);
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::~vector
            ((vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_> *)
             &scaled_up_tgt_invariant.
              super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

tchecker::state_status_t prev(tchecker::zg::transition_t const & t, bool src_delay_allowed, bool tgt_delay_allowed,
                                tchecker::dbm::db_t const * bounding_dbm)
  {
    assert(bounding_dbm != nullptr);
    assert(tchecker::dbm::is_consistent(bounding_dbm, _dim));
    assert(tchecker::dbm::is_tight(bounding_dbm, _dim));

    // scale up invariants, guard and reset to _denominator
    tchecker::clock_constraint_container_t scaled_up_src_invariant = scale_up(t.src_invariant_container());
    tchecker::clock_constraint_container_t scaled_up_tgt_invariant = scale_up(t.tgt_invariant_container());
    tchecker::clock_constraint_container_t scaled_up_guard = scale_up(t.guard_container());
    tchecker::clock_reset_container_t scaled_up_reset = scale_up(t.reset_container());

    // compute DBM of previous clock valiations according to t and delays
    tchecker::state_status_t prev_status =
        _semantics.prev(_dbm, _dim, src_delay_allowed, scaled_up_src_invariant, scaled_up_guard, scaled_up_reset,
                        tgt_delay_allowed, scaled_up_tgt_invariant);

    if (prev_status != tchecker::STATE_OK) {
      invalidate();
      return prev_status;
    }

    // restrict to scaled-up bounding_dbm
    enum tchecker::dbm::status_t bounding_status = restrict_to_scaled_up_bounding_dbm(bounding_dbm);

    if (bounding_status != tchecker::dbm::NON_EMPTY) {
      invalidate();
      return tchecker::STATE_BAD;
    }

    // restrict to single valuation
    simplify();
    _denominator *= tchecker::dbm::constrain_to_single_valuation(_dbm, _dim);
    compute_clock_valuation_from_dbm();

    return tchecker::STATE_OK;
  }